

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternative.hpp
# Opt level: O0

type __thiscall
boost::spirit::classic::
alternative<boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::SetNrStates>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>>
::
parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
          (alternative<boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::SetNrStates>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,_boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>_>
           *this,scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
                 *scan)

{
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *this_00;
  action<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::SetNrStates>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>
  *in_RSI;
  bool bVar1;
  iterator_t save;
  result_t hit;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffff48;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff74;
  scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
  *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator((position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                       *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
  binary<$74ca2a22$>::left((binary<_74ca2a22_> *)0xa6cb94);
  local_8 = (ptrdiff_t)
            action<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::SetNrStates>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>
            ::
            parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
                      (in_RSI,in_stack_ffffffffffffffe0);
  this_00 = (position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
             *)safe_bool::operator_cast_to__
                         ((safe_bool<boost::spirit::classic::match<boost::spirit::classic::nil_t>,_boost::spirit::classic::impl::no_base<boost::spirit::classic::match<boost::spirit::classic::nil_t>_>_>
                           *)0xa6cbce);
  bVar1 = this_00 ==
          (position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
           *)0xffffffffffffffff;
  if (bVar1) {
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::operator=((position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                 *)0xffffffffffffffff,in_stack_ffffffffffffff48);
  }
  uVar2 = (uint)!bVar1;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(this_00);
  if (uVar2 == 0) {
    binary<$74ca2a22$>::right((binary<_74ca2a22_> *)0xa6cc44);
    local_8 = action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>
              ::
              parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
                        ((action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>
                          *)in_RSI,in_stack_ffffffffffffffe0);
  }
  return (type)local_8;
}

Assistant:

typename parser_result<self_t, ScannerT>::type
        parse(ScannerT const& scan) const
        {
            typedef typename parser_result<self_t, ScannerT>::type result_t;
            typedef typename ScannerT::iterator_t iterator_t;
            { // scope for save
                iterator_t save = scan.first;
                if (result_t hit = this->left().parse(scan))
                    return hit;
                scan.first = save;
            }
            return this->right().parse(scan);
        }